

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O1

void Acb_ManFree(Acb_Man_t *p)

{
  void *__ptr;
  void *pvVar1;
  void **__ptr_00;
  Hash_IntMan_t *__ptr_01;
  Vec_Int_t *pVVar2;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (1 < (p->vNtks).nSize) {
    lVar5 = 1;
    do {
      __ptr = (p->vNtks).pArray[lVar5];
      if (*(void **)((long)__ptr + 0x20) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x20));
        *(undefined8 *)((long)__ptr + 0x20) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x18) = 0;
      if (*(void **)((long)__ptr + 0x30) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x30));
        *(undefined8 *)((long)__ptr + 0x30) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x28) = 0;
      if (*(void **)((long)__ptr + 0x40) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x40));
        *(undefined8 *)((long)__ptr + 0x40) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x38) = 0;
      if (*(void **)((long)__ptr + 0x50) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x50));
        *(undefined8 *)((long)__ptr + 0x50) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x48) = 0;
      if (*(void **)((long)__ptr + 0x78) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x78));
        *(undefined8 *)((long)__ptr + 0x78) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x70) = 0;
      if (*(void **)((long)__ptr + 0x88) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x88));
        *(undefined8 *)((long)__ptr + 0x88) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x80) = 0;
      if (*(void **)((long)__ptr + 0x98) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x98));
        *(undefined8 *)((long)__ptr + 0x98) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x90) = 0;
      if (*(void **)((long)__ptr + 0xa8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xa8));
        *(undefined8 *)((long)__ptr + 0xa8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xa0) = 0;
      if (*(void **)((long)__ptr + 0xb8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xb8));
        *(undefined8 *)((long)__ptr + 0xb8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xb0) = 0;
      if (*(void **)((long)__ptr + 200) != (void *)0x0) {
        free(*(void **)((long)__ptr + 200));
        *(undefined8 *)((long)__ptr + 200) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xc0) = 0;
      if (*(void **)((long)__ptr + 0xd8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xd8));
        *(undefined8 *)((long)__ptr + 0xd8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xd0) = 0;
      if (*(void **)((long)__ptr + 0xe8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xe8));
        *(undefined8 *)((long)__ptr + 0xe8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xe0) = 0;
      if (*(void **)((long)__ptr + 0xf8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xf8));
        *(undefined8 *)((long)__ptr + 0xf8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xf0) = 0;
      if (*(void **)((long)__ptr + 0x108) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x108));
        *(undefined8 *)((long)__ptr + 0x108) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x100) = 0;
      if (*(void **)((long)__ptr + 0x118) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x118));
        *(undefined8 *)((long)__ptr + 0x118) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x110) = 0;
      if (*(void **)((long)__ptr + 0x128) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x128));
        *(undefined8 *)((long)__ptr + 0x128) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x120) = 0;
      if (*(void **)((long)__ptr + 0x138) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x138));
        *(undefined8 *)((long)__ptr + 0x138) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x130) = 0;
      if (*(void **)((long)__ptr + 0x148) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x148));
        *(undefined8 *)((long)__ptr + 0x148) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x140) = 0;
      if (*(void **)((long)__ptr + 0x158) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x158));
        *(undefined8 *)((long)__ptr + 0x158) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x150) = 0;
      if (*(void **)((long)__ptr + 0x168) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x168));
        *(undefined8 *)((long)__ptr + 0x168) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x160) = 0;
      if (*(void **)((long)__ptr + 0x178) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x178));
        *(undefined8 *)((long)__ptr + 0x178) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x170) = 0;
      if (*(void **)((long)__ptr + 0x188) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x188));
        *(undefined8 *)((long)__ptr + 0x188) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x180) = 0;
      if (*(void **)((long)__ptr + 0x198) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x198));
        *(undefined8 *)((long)__ptr + 0x198) = 0;
      }
      *(undefined8 *)((long)__ptr + 400) = 0;
      if (*(void **)((long)__ptr + 0x1a8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x1a8));
        *(undefined8 *)((long)__ptr + 0x1a8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x1a0) = 0;
      if (0 < *(int *)((long)__ptr + 0x1b0)) {
        lVar7 = 8;
        lVar6 = 0;
        do {
          pvVar1 = *(void **)(*(long *)((long)__ptr + 0x1b8) + lVar7);
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
            *(undefined8 *)(*(long *)((long)__ptr + 0x1b8) + lVar7) = 0;
          }
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar6 < *(int *)((long)__ptr + 0x1b0));
      }
      if (*(void **)((long)__ptr + 0x1b8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x1b8));
        *(undefined8 *)((long)__ptr + 0x1b8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x1b0) = 0;
      if (0 < *(int *)((long)__ptr + 0x1c0)) {
        lVar7 = 8;
        lVar6 = 0;
        do {
          pvVar1 = *(void **)(*(long *)((long)__ptr + 0x1c8) + lVar7);
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
            *(undefined8 *)(*(long *)((long)__ptr + 0x1c8) + lVar7) = 0;
          }
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar6 < *(int *)((long)__ptr + 0x1c0));
      }
      if (*(void **)((long)__ptr + 0x1c8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x1c8));
        *(undefined8 *)((long)__ptr + 0x1c8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x1c0) = 0;
      if (*(void **)((long)__ptr + 0x1d8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x1d8));
        *(undefined8 *)((long)__ptr + 0x1d8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x1d0) = 0;
      if (*(void **)((long)__ptr + 0x1e8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x1e8));
        *(undefined8 *)((long)__ptr + 0x1e8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x1e0) = 0;
      pvVar1 = *(void **)((long)__ptr + 0x1f0);
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 0x10) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 0x10));
          *(undefined8 *)((long)pvVar1 + 0x10) = 0;
        }
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        free(pvVar1);
      }
      *(undefined8 *)((long)__ptr + 0x1f0) = 0;
      if (*(void **)((long)__ptr + 0x200) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x200));
        *(undefined8 *)((long)__ptr + 0x200) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x1f8) = 0;
      if (*(void **)((long)__ptr + 0x210) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x210));
        *(undefined8 *)((long)__ptr + 0x210) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x208) = 0;
      if (*(void **)((long)__ptr + 0x220) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x220));
        *(undefined8 *)((long)__ptr + 0x220) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x218) = 0;
      if (*(void **)((long)__ptr + 0x230) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x230));
        *(undefined8 *)((long)__ptr + 0x230) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x228) = 0;
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vNtks).nSize);
  }
  __ptr_00 = (p->vNtks).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vNtks).pArray = (void **)0x0;
  }
  Abc_NamDeref(p->pStrs);
  Abc_NamDeref(p->pFuns);
  Abc_NamDeref(p->pMods);
  __ptr_01 = p->vHash;
  if (__ptr_01 != (Hash_IntMan_t *)0x0) {
    piVar3 = &__ptr_01->nRefs;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      pVVar2 = __ptr_01->vObjs;
      if (pVVar2->pArray != (int *)0x0) {
        free(pVVar2->pArray);
        pVVar2->pArray = (int *)0x0;
      }
      if (pVVar2 != (Vec_Int_t *)0x0) {
        free(pVVar2);
      }
      pVVar2 = __ptr_01->vTable;
      if (pVVar2->pArray != (int *)0x0) {
        free(pVVar2->pArray);
        pVVar2->pArray = (int *)0x0;
      }
      if (pVVar2 != (Vec_Int_t *)0x0) {
        free(pVVar2);
      }
      free(__ptr_01);
    }
  }
  piVar3 = (p->vNameMap).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vNameMap).pArray = (int *)0x0;
  }
  (p->vNameMap).nCap = 0;
  (p->vNameMap).nSize = 0;
  piVar3 = (p->vUsed).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vUsed).pArray = (int *)0x0;
  }
  (p->vUsed).nCap = 0;
  (p->vUsed).nSize = 0;
  piVar3 = (p->vNameMap2).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vNameMap2).pArray = (int *)0x0;
  }
  (p->vNameMap2).nCap = 0;
  (p->vNameMap2).nSize = 0;
  piVar3 = (p->vUsed2).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vUsed2).pArray = (int *)0x0;
  }
  (p->vUsed2).nCap = 0;
  (p->vUsed2).nSize = 0;
  pcVar4 = (p->vOut).pArray;
  if (pcVar4 != (char *)0x0) {
    free(pcVar4);
    (p->vOut).pArray = (char *)0x0;
  }
  (p->vOut).nCap = 0;
  (p->vOut).nSize = 0;
  pcVar4 = (p->vOut2).pArray;
  if (pcVar4 != (char *)0x0) {
    free(pcVar4);
    (p->vOut2).pArray = (char *)0x0;
  }
  (p->vOut2).nCap = 0;
  (p->vOut2).nSize = 0;
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  free(p);
  return;
}

Assistant:

static inline void Acb_ManFree( Acb_Man_t * p )
{
    Acb_Ntk_t * pNtk; int i;
    Acb_ManForEachNtk( p, pNtk, i )
        Acb_NtkFree( pNtk );
    ABC_FREE( p->vNtks.pArray );
    Abc_NamDeref( p->pStrs );
    Abc_NamDeref( p->pFuns );
    Abc_NamDeref( p->pMods );
    Hash_IntManDeref( p->vHash );
    Vec_IntErase( &p->vNameMap );
    Vec_IntErase( &p->vUsed );
    Vec_IntErase( &p->vNameMap2 );
    Vec_IntErase( &p->vUsed2 );
    Vec_StrErase( &p->vOut );
    Vec_StrErase( &p->vOut2 );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}